

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_v2i(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  long in_RSI;
  exr_attr_v2i_t tmp;
  exr_result_t rv;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffec;
  
  uVar2 = (undefined4)**(undefined8 **)(in_RSI + 0x18);
  eVar1 = save_attr_sz((_internal_exr_context *)
                       CONCAT44(in_stack_ffffffffffffffec,
                                (int)((ulong)**(undefined8 **)(in_RSI + 0x18) >> 0x20)),
                       CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  if (eVar1 == 0) {
    eVar1 = save_attr_32((_internal_exr_context *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8,0);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_v2i (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t   rv;
    exr_attr_v2i_t tmp = *(a->v2i);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_v2i_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 2);
    return rv;
}